

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::shlI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type *__return_storage_ptr___00;
  long lVar1;
  Literal *pLVar2;
  undefined1 local_128 [8];
  LaneArray<8> lanes;
  anon_union_16_5_9943fe1e_for_Literal_0 local_50;
  undefined8 local_40;
  Literal *local_38;
  
  local_38 = __return_storage_ptr__;
  if ((other->type).id != 2) {
    __assert_fail("shift.type == Type::i32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0x785,
                  "Literal wasm::shift(const Literal &, const Literal &) [Lanes = 8, IntoLanes = &wasm::Literal::getLanesUI16x8, ShiftOp = &wasm::Literal::shl]"
                 );
  }
  getLanes<unsigned_short,8>((LaneArray<8> *)local_128,(wasm *)this,other);
  lVar1 = 0;
  __return_storage_ptr___00 = &lanes._M_elems[7].type;
  do {
    if ((other->type).id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    pLVar2 = (Literal *)(local_128 + lVar1);
    local_50.i32 = (other->field_0).i32 & 0xf;
    local_40 = 2;
    shl((Literal *)__return_storage_ptr___00,pLVar2,(Literal *)&local_50.func);
    if (pLVar2 != (Literal *)__return_storage_ptr___00) {
      ~Literal(pLVar2);
      Literal(pLVar2,(Literal *)__return_storage_ptr___00);
    }
    ~Literal((Literal *)__return_storage_ptr___00);
    ~Literal((Literal *)&local_50.func);
    pLVar2 = local_38;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(local_38,(LaneArray<8> *)local_128);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_128 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return pLVar2;
}

Assistant:

Literal Literal::shlI16x8(const Literal& other) const {
  return shift<8, &Literal::getLanesUI16x8, &Literal::shl>(*this, other);
}